

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O2

void __thiscall
MaterialSystemTest_testIntProperty_Test::TestBody(MaterialSystemTest_testIntProperty_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  int pf;
  
  pf = 0xe57b1f;
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,&pf,1,"testKey3",0,0);
  pf = 0xc;
  local_48.ptr_._0_4_ = 0;
  local_40.data_._0_4_ =
       aiGetMaterialInteger((this->super_MaterialSystemTest).pcMat,"testKey3",0,0,&pf);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&gtest_ar,"aiReturn_SUCCESS","pcMat->Get(\"testKey3\",0,0,pf)",
             (aiReturn *)&local_48,(aiReturn *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.ptr_._0_4_ = 0xe57b1f;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"15039263","pf",(int *)&local_48,&pf);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x5c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testIntProperty)
{
    int pf = 15039263;
    this->pcMat->AddProperty(&pf,1,"testKey3");
    pf = 12;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey3",0,0,pf));
    EXPECT_EQ(15039263, pf);
}